

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O3

void __thiscall
wasm::ModuleUtils::
ParallelFunctionAnalysis<std::vector<wasm::Name,_std::allocator<wasm::Name>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
::ParallelFunctionAnalysis::Mapper::~Mapper(Mapper *this)

{
  void *pvVar1;
  
  *(undefined ***)this = &PTR__Mapper_00d773b8;
  if (*(code **)(this + 0x128) != (code *)0x0) {
    (**(code **)(this + 0x128))(this + 0x118,this + 0x118,3);
  }
  pvVar1 = *(void **)(this + 0xe0);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)(this + 0xf0) - (long)pvVar1);
  }
  *(undefined ***)this = &PTR__Pass_00d722d8;
  if (*(Mapper **)(this + 0x10) != this + 0x20) {
    operator_delete(*(Mapper **)(this + 0x10),*(long *)(this + 0x20) + 1);
  }
  operator_delete(this,0x138);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }